

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O0

vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_> *
wasm::StringifyProcessor::filterLocalSets
          (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           *__return_storage_ptr__,
          vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
          *substrings,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs)

{
  anon_class_1_0_00000001 local_41;
  function<bool_(const_wasm::Expression_*)> local_40;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *local_20;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs_local;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  *substrings_local;
  
  local_20 = exprs;
  exprs_local = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)substrings;
  substrings_local = __return_storage_ptr__;
  std::function<bool(wasm::Expression_const*)>::
  function<wasm::StringifyProcessor::filterLocalSets(std::vector<wasm::SuffixTree::RepeatedSubstring,std::allocator<wasm::SuffixTree::RepeatedSubstring>>const&,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>const&)::__0,void>
            ((function<bool(wasm::Expression_const*)> *)&local_40,&local_41);
  filter(__return_storage_ptr__,substrings,exprs,&local_40);
  std::function<bool_(const_wasm::Expression_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SuffixTree::RepeatedSubstring> StringifyProcessor::filterLocalSets(
  const std::vector<SuffixTree::RepeatedSubstring>& substrings,
  const std::vector<Expression*>& exprs) {
  return StringifyProcessor::filter(
    substrings, exprs, [](const Expression* curr) {
      return curr->is<LocalSet>();
    });
}